

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter.c
# Opt level: O0

int archive_write_add_filter(archive *a,int code)

{
  int iVar1;
  int in_ESI;
  archive *in_RDI;
  int i;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (codes[local_18].code == -1) {
      archive_set_error(in_RDI,0x16,"No such filter");
      return -0x1e;
    }
    if (in_ESI == codes[local_18].code) break;
    local_18 = local_18 + 1;
  }
  iVar1 = (*codes[local_18].setter)(in_RDI);
  return iVar1;
}

Assistant:

int
archive_write_add_filter(struct archive *a, int code)
{
	int i;

	for (i = 0; codes[i].code != -1; i++) {
		if (code == codes[i].code)
			return ((codes[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such filter");
	return (ARCHIVE_FATAL);
}